

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O2

void __thiscall
cbtBvhTree::_build_sub_tree
          (cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  GIM_BVH_DATA *pGVar1;
  undefined8 *puVar2;
  cbtScalar *pcVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  cbtBvhTree *this_00;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  cbtAABB local_50;
  
  iVar4 = *(int *)this;
  *(int *)this = iVar4 + 1;
  this_00 = (cbtBvhTree *)(ulong)(uint)(endIndex - startIndex);
  if (endIndex - startIndex == 1) {
    lVar9 = (long)iVar4 * 0x24;
    pGVar1 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data + startIndex;
    uVar5 = *(undefined8 *)((pGVar1->m_bound).m_min.m_floats + 2);
    uVar6 = *(undefined8 *)(pGVar1->m_bound).m_max.m_floats;
    uVar7 = *(undefined8 *)((pGVar1->m_bound).m_max.m_floats + 2);
    puVar2 = (undefined8 *)(*(long *)(this + 0x18) + lVar9);
    *puVar2 = *(undefined8 *)(pGVar1->m_bound).m_min.m_floats;
    puVar2[1] = uVar5;
    puVar2[2] = uVar6;
    puVar2[3] = uVar7;
    *(int *)(*(long *)(this + 0x18) + 0x20 + lVar9) =
         (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[startIndex].m_data;
  }
  else {
    iVar8 = _calc_splitting_axis(this_00,primitive_boxes,startIndex,endIndex);
    iVar8 = _sort_and_calc_splitting_index(this_00,primitive_boxes,startIndex,endIndex,iVar8);
    auVar11._8_4_ = 0x7f7fffff;
    auVar11._0_8_ = 0x7f7fffff7f7fffff;
    auVar11._12_4_ = 0x7f7fffff;
    auVar12._8_4_ = 0xff7fffff;
    auVar12._0_8_ = 0xff7fffffff7fffff;
    auVar12._12_4_ = 0xff7fffff;
    lVar9 = (long)startIndex;
    lVar10 = lVar9 * 0x24;
    local_50.m_min.m_floats._0_8_ = vmovlps_avx(auVar11);
    local_50.m_min.m_floats[2] = 3.4028235e+38;
    local_50.m_max.m_floats._0_8_ = vmovlps_avx(auVar12);
    local_50.m_max.m_floats[2] = -3.4028235e+38;
    for (; lVar9 < endIndex; lVar9 = lVar9 + 1) {
      cbtAABB::merge(&local_50,
                     (cbtAABB *)
                     ((long)(((primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data)->
                            m_bound).m_min.m_floats + lVar10));
      lVar10 = lVar10 + 0x24;
    }
    lVar9 = (long)iVar4 * 0x24;
    pcVar3 = (cbtScalar *)(*(long *)(this + 0x18) + lVar9);
    *(undefined8 *)pcVar3 = local_50.m_min.m_floats._0_8_;
    *(ulong *)(pcVar3 + 2) = CONCAT44(local_50.m_min.m_floats[3],local_50.m_min.m_floats[2]);
    *(undefined8 *)(pcVar3 + 4) = local_50.m_max.m_floats._0_8_;
    *(ulong *)(pcVar3 + 6) = CONCAT44(local_50.m_max.m_floats[3],local_50.m_max.m_floats[2]);
    _build_sub_tree(this,primitive_boxes,startIndex,iVar8);
    _build_sub_tree(this,primitive_boxes,iVar8,endIndex);
    *(int *)(*(long *)(this + 0x18) + 0x20 + lVar9) = iVar4 - *(int *)this;
  }
  return;
}

Assistant:

void cbtBvhTree::_build_sub_tree(GIM_BVH_DATA_ARRAY& primitive_boxes, int startIndex, int endIndex)
{
	int curIndex = m_num_nodes;
	m_num_nodes++;

	cbtAssert((endIndex - startIndex) > 0);

	if ((endIndex - startIndex) == 1)
	{
		//We have a leaf node
		setNodeBound(curIndex, primitive_boxes[startIndex].m_bound);
		m_node_array[curIndex].setDataIndex(primitive_boxes[startIndex].m_data);

		return;
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.

	//split axis
	int splitIndex = _calc_splitting_axis(primitive_boxes, startIndex, endIndex);

	splitIndex = _sort_and_calc_splitting_index(
		primitive_boxes, startIndex, endIndex,
		splitIndex  //split axis
	);

	//calc this node bounding box

	cbtAABB node_bound;
	node_bound.invalidate();

	for (int i = startIndex; i < endIndex; i++)
	{
		node_bound.merge(primitive_boxes[i].m_bound);
	}

	setNodeBound(curIndex, node_bound);

	//build left branch
	_build_sub_tree(primitive_boxes, startIndex, splitIndex);

	//build right branch
	_build_sub_tree(primitive_boxes, splitIndex, endIndex);

	m_node_array[curIndex].setEscapeIndex(m_num_nodes - curIndex);
}